

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O2

void pzshape::TPZShapeLinear::Hermite
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  double local_50;
  REAL local_48;
  double local_40;
  double local_38;
  
  if (0 < num) {
    local_50 = 1.0;
    local_48 = x;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (phi,0,0,&local_50);
    local_50 = 0.0;
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (dphi,0,0,&local_50);
    if (num != 1) {
      local_50 = local_48 + local_48;
      local_48 = local_50;
      (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (phi,1,0,&local_50);
      local_50 = 2.0;
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (dphi,0,1,&local_50);
      lVar2 = (ulong)(uint)num - 2;
      lVar3 = 2;
      while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
        pdVar1 = TPZFMatrix<double>::operator()(phi,lVar3 + -1,0);
        local_40 = (double)(int)lVar3 + (double)(int)lVar3 + -1.0;
        local_38 = *pdVar1 * local_48;
        pdVar1 = TPZFMatrix<double>::operator()(phi,lVar3 + -2,0);
        local_50 = local_38 - *pdVar1 * local_40;
        (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20]
        )(phi,lVar3,0,&local_50);
        pdVar1 = TPZFMatrix<double>::operator()(phi,lVar3 + -2,0);
        local_50 = local_40 * *pdVar1;
        (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x20])(dphi,0,lVar3,&local_50);
        lVar3 = lVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Hermite(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		// Quadratic or higher shape functions (for physicists)
		if(num <= 0) return;
		phi.Put(0,0,1.0);
		dphi.Put(0,0, 0.0);
		if(num == 1) return;
		phi.Put(1,0, 2.0*x);
		dphi.Put(0,1, 2.0);
        // Following http://mathworld.wolfram.com/HermitePolynomial.html
		for(int ord = 2;ord<num;ord++) {
			phi.Put(ord,0, 2.0*x*phi(ord-1,0) - (2.0*(REAL)ord-1.0)*phi(ord-2,0));
			dphi.Put(0,ord, (2.0*(REAL)ord-1.0)*phi(ord-2,0));
		}
	}